

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int gost_cipher_do_cnt(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  uchar *buf;
  uchar *iv;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  
  buf = (uchar *)EVP_CIPHER_CTX_buf_noconst();
  iv = (uchar *)EVP_CIPHER_CTX_iv_noconst(ctx);
  iVar1 = EVP_CIPHER_CTX_get_num(ctx);
  if (iVar1 == 0) {
    uVar4 = 0;
  }
  else {
    iVar1 = EVP_CIPHER_CTX_get_num(ctx);
    for (uVar4 = 0; (uVar5 = (long)iVar1 + uVar4, uVar5 < 8 && (uVar4 < inl)); uVar4 = uVar4 + 1) {
      out[uVar4] = in[uVar4] ^ buf[uVar4 + (long)iVar1];
    }
    if (uVar5 != 8) {
      uVar5 = (ulong)(uint)(iVar1 + (int)uVar4);
      goto LAB_0011665f;
    }
    out = out + uVar4;
    in = in + uVar4;
    EVP_CIPHER_CTX_set_num(ctx,0);
  }
  for (; 7 < inl - uVar4; uVar4 = uVar4 + 8) {
    pvVar3 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    gost_cnt_next(pvVar3,iv,buf);
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      out[lVar2] = in[lVar2] ^ buf[lVar2];
    }
    in = in + 8;
    out = out + 8;
  }
  uVar5 = 0;
  if (uVar4 < inl) {
    pvVar3 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx,0);
    gost_cnt_next(pvVar3,iv,buf);
    for (uVar5 = 0; uVar4 + uVar5 < inl; uVar5 = uVar5 + 1) {
      out[uVar5] = in[uVar5] ^ buf[uVar5];
    }
  }
LAB_0011665f:
  EVP_CIPHER_CTX_set_num(ctx,uVar5);
  return 1;
}

Assistant:

static int gost_cipher_do_cnt(EVP_CIPHER_CTX *ctx, unsigned char *out,
                              const unsigned char *in, size_t inl)
{
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    size_t i = 0;
    size_t j;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
/* process partial block if any */
    if (EVP_CIPHER_CTX_num(ctx)) {
        for (j = EVP_CIPHER_CTX_num(ctx), i = 0; j < 8 && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            *out_ptr = buf[j] ^ (*in_ptr);
        }
        if (j == 8) {
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, j);
            return 1;
        }
    }

    for (; (inl - i) >= 8; i += 8, in_ptr += 8, out_ptr += 8) {
        /*
         * block cipher current iv
         */
        /* Encrypt */
        gost_cnt_next(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        for (j = 0; j < 8; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
    }
/* Process rest of buffer */
    if (i < inl) {
        gost_cnt_next(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, j);
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }
    return 1;
}